

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.hpp
# Opt level: O0

void __thiscall
peach::expression::AssignExpression::AssignExpression
          (AssignExpression *this,ExprShPtr *left,ExprShPtr *right,FunctionType *functor)

{
  bool bVar1;
  invalid_argument *this_00;
  shared_ptr<peach::expression::Expression> local_48 [2];
  FunctionType *local_28;
  FunctionType *functor_local;
  ExprShPtr *right_local;
  ExprShPtr *left_local;
  AssignExpression *this_local;
  
  local_28 = functor;
  functor_local = (FunctionType *)right;
  right_local = left;
  left_local = (ExprShPtr *)this;
  SingleIndentationLevelExpression::SingleIndentationLevelExpression
            (&this->super_SingleIndentationLevelExpression);
  (this->super_SingleIndentationLevelExpression).super_Expression._vptr_Expression =
       (_func_int **)&PTR_eval_001d99f8;
  std::shared_ptr<peach::expression::LvalueExpression>::shared_ptr(&this->left_);
  std::shared_ptr<peach::expression::Expression>::shared_ptr(&this->right_);
  std::function<void_(int_&,_int)>::function(&this->functor_,functor);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)left);
  if ((bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)right), bVar1)) {
    std::dynamic_pointer_cast<peach::expression::LvalueExpression,peach::expression::Expression>
              (local_48);
    std::shared_ptr<peach::expression::LvalueExpression>::operator=
              (&this->left_,(shared_ptr<peach::expression::LvalueExpression> *)local_48);
    std::shared_ptr<peach::expression::LvalueExpression>::~shared_ptr
              ((shared_ptr<peach::expression::LvalueExpression> *)local_48);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->left_);
    if (!bVar1) {
      exception::throwFromCoords<peach::exception::InvalidAssignationError>(0,0);
    }
    std::shared_ptr<peach::expression::Expression>::operator=(&this->right_,right);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"nullptr expression in AssignExpression constructor");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

AssignExpression(
        ExprShPtr left,
        ExprShPtr right,
        FunctionType functor)
        : functor_(std::move(functor))
    {
        if (!left || !right)
        {
            throw std::invalid_argument("nullptr expression in AssignExpression constructor");
        }
        left_ = std::dynamic_pointer_cast<LvalueExpression>(left);
        if (!left_)
        {
            exception::throwFromCoords<exception::InvalidAssignationError>(0, 0); // TODO: expression must know its position
        }
        right_ = std::move(right);
    }